

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * __thiscall
chaiscript::exception::eval_error::format_detail_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_functions,bool t_dot_notation,Dispatch_Engine *t_ss)

{
  bool bVar1;
  size_type sVar2;
  __shared_ptr *this_00;
  ostream *poVar3;
  eval_error *peVar4;
  undefined7 in_register_00000009;
  string local_220;
  eval_error *local_200;
  shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *t_function;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *__range3;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  undefined8 local_28;
  Dispatch_Engine *t_ss_local;
  eval_error *peStack_18;
  bool t_dot_notation_local;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *t_functions_local;
  
  local_28 = CONCAT71(in_register_00000009,t_dot_notation);
  t_ss_local._7_1_ = (byte)t_functions & 1;
  peStack_18 = this;
  t_functions_local =
       (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
        *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  sVar2 = std::
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          ::size((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                  *)peStack_18);
  if (sVar2 == 1) {
    this_00 = (__shared_ptr *)
              std::
              vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
              ::operator[]((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                            *)peStack_18,0);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (!bVar1) {
      __assert_fail("t_functions[0]",
                    "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/static_libs/../include/chaiscript/language/chaiscript_common.hpp"
                    ,0x1d4,
                    "static std::string chaiscript::exception::eval_error::format_detail(const std::vector<chaiscript::Const_Proxy_Function> &, bool, const chaiscript::detail::Dispatch_Engine &)"
                   );
    }
    poVar3 = std::operator<<(local_1a0,"  Expected: ");
    peVar4 = (eval_error *)
             std::
             vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
             ::operator[]((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                           *)peStack_18,0);
    format_types_abi_cxx11_
              ((string *)&__range3,peVar4,(Const_Proxy_Function *)(ulong)(t_ss_local._7_1_ & 1),
               SUB81(local_28,0),t_ss);
    poVar3 = std::operator<<(poVar3,(string *)&__range3);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&__range3);
  }
  else {
    poVar3 = std::operator<<(local_1a0,"  ");
    sVar2 = std::
            vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
            ::size((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                    *)peStack_18);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
    std::operator<<(poVar3," overloads available:\n");
    peVar4 = peStack_18;
    __end3 = std::
             vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
             ::begin((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                      *)peStack_18);
    t_function = (shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)
                 std::
                 vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                 ::end((vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
                        *)peVar4);
    while (bVar1 = __gnu_cxx::
                   operator==<const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                             (&__end3,(__normal_iterator<const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                                       *)&t_function), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_200 = (eval_error *)
                  __gnu_cxx::
                  __normal_iterator<const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                  ::operator*(&__end3);
      poVar3 = std::operator<<(local_1a0,"      ");
      format_types_abi_cxx11_
                (&local_220,local_200,(Const_Proxy_Function *)(ulong)(t_ss_local._7_1_ & 1),
                 SUB81(local_28,0),t_ss);
      poVar3 = std::operator<<(poVar3,(string *)&local_220);
      std::operator<<(poVar3,'\n');
      std::__cxx11::string::~string((string *)&local_220);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>_>
      ::operator++(&__end3);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_detail(const std::vector<chaiscript::Const_Proxy_Function> &t_functions,
                                       bool t_dot_notation,
                                       const chaiscript::detail::Dispatch_Engine &t_ss) {
        std::stringstream ss;
        if (t_functions.size() == 1) {
          assert(t_functions[0]);
          ss << "  Expected: " << format_types(t_functions[0], t_dot_notation, t_ss) << '\n';
        } else {
          ss << "  " << t_functions.size() << " overloads available:\n";

          for (const auto &t_function : t_functions) {
            ss << "      " << format_types((t_function), t_dot_notation, t_ss) << '\n';
          }
        }

        return ss.str();
      }